

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::TextReader<fmt::Locale>::ReportError<>(TextReader<fmt::Locale> *this,CStringRef arg0)

{
  uint64_t types;
  CStringRef in_RSI;
  Type array;
  ArgList *in_stack_ffffffffffffffc0;
  anon_union_8_2_de49483c_for_ArgList_1 in_stack_ffffffffffffffc8;
  anon_union_16_12_986ea841_for_Value_0 local_28 [2];
  
  local_28[0].long_long_value = 0;
  local_28[0].string.size = 0;
  types = fmt::internal::make_type();
  fmt::ArgList::ArgList((ArgList *)&stack0xffffffffffffffc0,types,(Value *)&local_28[0].string);
  ReportError((TextReader<fmt::Locale> *)in_stack_ffffffffffffffc8.values_,in_RSI,
              in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void ReadTillEndOfLine() {
    while (char c = *ptr_) {
      ++ptr_;
      if (c == '\n') {
        line_start_ = ptr_;
        ++line_;
        return;
      }
    }
    DoReportError(ptr_, "expected newline");
  }